

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void dbg_print_buf(void *buf,uint64_t buflen,bool hex,int align)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  
  if (buf == (void *)0x0) {
    fwrite("(null)\n",7,1,_stderr);
    return;
  }
  if (hex) {
    fprintf(_stderr,"(hex) 0x%lx, %lu (0x%lx) bytes\n",buf,buflen,buflen);
    uVar3 = 0;
    while (uVar3 < buflen) {
      fprintf(_stderr,"   %04x   ",uVar3 & 0xffffffff);
      uVar1 = uVar3 + (long)align;
      uVar4 = uVar3;
      while (uVar4 < uVar1) {
        if (uVar4 < buflen) {
          fprintf(_stderr,"%02x ",(ulong)*(byte *)((long)buf + uVar4));
        }
        else {
          fwrite("   ",3,1,_stderr);
        }
        uVar4 = uVar4 + 1;
        if ((uVar4 & 7) == 0) {
          fputc(0x20,_stderr);
        }
      }
      fputc(0x20,_stderr);
      uVar5 = buflen;
      if (uVar1 < buflen) {
        uVar5 = uVar1;
      }
      for (; uVar3 < uVar5; uVar3 = uVar3 + 1) {
        bVar2 = *(byte *)((long)buf + uVar3);
        if (0x5d < (byte)(bVar2 - 0x20)) {
          bVar2 = 0x2e;
        }
        fputc((uint)bVar2,_stderr);
      }
      fputc(10,_stderr);
      uVar3 = uVar1;
    }
    return;
  }
  fprintf(_stderr,"%.*s\n",buflen & 0xffffffff,buf);
  return;
}

Assistant:

void dbg_print_buf(void *buf, uint64_t buflen, bool hex, int align)
{
    if (!buf) {
        fprintf(stderr, "(null)\n");
        return;
    }

    if (!hex) {
        // plaintext
        fprintf(stderr, "%.*s\n", (int)buflen, (char*)buf);
        return;
    }

    // hex dump
    size_t i, j;
    fprintf(stderr, "(hex) 0x%" _X64 ", %" _F64 " (0x%" _X64 ") bytes\n",
            (uint64_t)buf, buflen, buflen);
    for (i=0;i<buflen;i+=align) {
        fprintf(stderr, "   %04x   ", (int)i);
        for (j=i; j<i+align; ++j){
            if (j<buflen) {
                fprintf(stderr, "%02x ", ((uint8_t*)buf)[j]);
            } else {
                fprintf(stderr, "   ");
            }
            if ((j+1)%8 == 0) {
                fprintf(stderr, " ");
            }
        }
        fprintf(stderr, " ");
        for (j=i; j<i+align && j<buflen; ++j){
            // print only readable ascii character
            fprintf(stderr, "%c",
             (0x20 <= ((char*)buf)[j] && ((char*)buf)[j] <= 0x7d)?
                       ((char*)buf)[j] : '.'  );
        }
        fprintf(stderr, "\n");
    }
}